

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O0

void mapDraw(vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *obstalces,Obstacle *obst,Mat *src)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *vec;
  _InputOutputArray *p_Var4;
  const_reference pvVar5;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *in_RSI;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *in_RDI;
  Point *pt_1;
  const_iterator __end1;
  const_iterator __begin1;
  Obstacle *__range1;
  size_t i_1;
  Point *pt;
  const_iterator __end2;
  const_iterator __begin2;
  value_type *__range2;
  size_t i;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffdd4;
  Point_<int> *in_stack_fffffffffffffdd8;
  Point_<int> *m;
  _InputOutputArray *in_stack_fffffffffffffde0;
  _InputOutputArray *this;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined1 local_1f0 [32];
  Point_<int> local_1d0;
  undefined1 local_1c8 [24];
  Point_<int> *local_1b0;
  Point_<int> *local_1a8;
  __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_1a0;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_198;
  undefined1 local_190 [32];
  Point_<int> local_170;
  Point_<int> local_168;
  undefined1 local_160 [24];
  _InputOutputArray *local_148;
  undefined1 local_140 [32];
  Point_<int> local_120;
  undefined1 local_118 [24];
  Point_<int> *local_100;
  Point_<int> *local_f8;
  __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_f0;
  const_reference local_e8;
  Point_<int> local_e0;
  undefined1 local_d8 [32];
  _InputArray local_b8;
  undefined1 local_a0 [24];
  Point_<int> local_88;
  undefined1 local_80 [48];
  _InputArray local_50;
  undefined1 local_38 [24];
  ulong local_20;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *local_10;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_8;
  
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    uVar1 = local_20;
    sVar3 = std::
            vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            ::size(local_8);
    if (sVar3 <= uVar1) break;
    cv::_InputOutputArray::_InputOutputArray
              (in_stack_fffffffffffffde0,(Mat *)in_stack_fffffffffffffdd8);
    cv::_InputArray::_InputArray<cv::Point_<int>>
              ((_InputArray *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)in_stack_fffffffffffffdc8);
    uVar1 = local_20;
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (double)in_stack_fffffffffffffde8,(double)in_stack_fffffffffffffde0,
               (double)in_stack_fffffffffffffdd8,
               (double)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    vec = (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           *)cv::noArray();
    cv::Point_<int>::Point_(&local_88);
    m = &local_88;
    uVar6 = 0x7fffffff;
    cv::drawContours(local_38,&local_50,uVar1 & 0xffffffff,local_80,0xffffffff,8);
    cv::_InputArray::~_InputArray(&local_50);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x16193f);
    cv::_InputOutputArray::_InputOutputArray(in_stack_fffffffffffffde0,(Mat *)m);
    cv::_InputArray::_InputArray<cv::Point_<int>>
              ((_InputArray *)CONCAT44(in_stack_fffffffffffffdd4,uVar6),vec);
    in_stack_fffffffffffffdf4 = (undefined4)local_20;
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)CONCAT44((undefined4)local_20,in_stack_fffffffffffffdf0),
               (double)in_stack_fffffffffffffde8,(double)in_stack_fffffffffffffde0,(double)m,
               (double)CONCAT44(in_stack_fffffffffffffdd4,uVar6));
    in_stack_fffffffffffffdc8 =
         (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)cv::noArray();
    cv::Point_<int>::Point_(&local_e0);
    in_stack_fffffffffffffdd8 = &local_e0;
    in_stack_fffffffffffffdd0 = 0x7fffffff;
    in_stack_fffffffffffffde8 = in_stack_fffffffffffffdc8;
    cv::drawContours(local_a0,&local_b8,in_stack_fffffffffffffdf4,local_d8,3,8);
    cv::_InputArray::~_InputArray(&local_b8);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x161a18);
    local_e8 = std::
               vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ::operator[](local_8,local_20);
    local_f0._M_current =
         (Point_<int> *)
         std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin
                   (in_stack_fffffffffffffdc8);
    local_f8 = (Point_<int> *)
               std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end
                         (in_stack_fffffffffffffdc8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (__normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                          *)in_stack_fffffffffffffdc8);
      if (!bVar2) break;
      local_100 = __gnu_cxx::
                  __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                  ::operator*(&local_f0);
      cv::_InputOutputArray::_InputOutputArray
                (in_stack_fffffffffffffde0,(Mat *)in_stack_fffffffffffffdd8);
      cv::Point_<int>::Point_(&local_120,local_100);
      cv::Scalar_<double>::Scalar_
                ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (double)in_stack_fffffffffffffde8,(double)in_stack_fffffffffffffde0,
                 (double)in_stack_fffffffffffffdd8,
                 (double)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      in_stack_fffffffffffffdc8 =
           (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
           ((ulong)in_stack_fffffffffffffdc8 & 0xffffffff00000000);
      cv::circle(local_118,&local_120,2,local_140,0xffffffff,8);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x161b1f);
      __gnu_cxx::
      __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
      ::operator++(&local_f0);
    }
    local_20 = local_20 + 1;
  }
  local_148 = (_InputOutputArray *)0x1;
  while( true ) {
    this = local_148;
    p_Var4 = (_InputOutputArray *)
             std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(local_10);
    if (p_Var4 <= this) break;
    cv::_InputOutputArray::_InputOutputArray(this,(Mat *)in_stack_fffffffffffffdd8);
    pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       (local_10,(size_type)
                                 ((long)&local_148[-1].super__OutputArray.super__InputArray.sz.
                                         height + 3));
    cv::Point_<int>::Point_(&local_168,pvVar5);
    pvVar5 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       (local_10,(size_type)local_148);
    cv::Point_<int>::Point_(&local_170,pvVar5);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (double)in_stack_fffffffffffffde8,(double)this,(double)in_stack_fffffffffffffdd8,
               (double)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    in_stack_fffffffffffffdc8 =
         (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
         ((ulong)in_stack_fffffffffffffdc8 & 0xffffffff00000000);
    cv::line(local_160,&local_168,&local_170,local_190,3,8);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x161d0a);
    local_148 = (_InputOutputArray *)
                ((long)&(local_148->super__OutputArray).super__InputArray.flags + 1);
  }
  local_198 = local_10;
  local_1a0._M_current =
       (Point_<int> *)
       std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin
                 (in_stack_fffffffffffffdc8);
  local_1a8 = (Point_<int> *)
              std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end
                        (in_stack_fffffffffffffdc8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (__normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (!bVar2) break;
    local_1b0 = __gnu_cxx::
                __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                ::operator*(&local_1a0);
    cv::_InputOutputArray::_InputOutputArray(this,(Mat *)in_stack_fffffffffffffdd8);
    cv::Point_<int>::Point_(&local_1d0,local_1b0);
    cv::Scalar_<double>::Scalar_
              ((Scalar_<double> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (double)in_stack_fffffffffffffde8,(double)this,(double)in_stack_fffffffffffffdd8,
               (double)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    in_stack_fffffffffffffdc8 =
         (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
         ((ulong)in_stack_fffffffffffffdc8 & 0xffffffff00000000);
    cv::circle(local_1c8,&local_1d0,2,local_1f0,0xffffffff,8);
    cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x161e2e);
    __gnu_cxx::
    __normal_iterator<const_cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
    ::operator++(&local_1a0);
  }
  return;
}

Assistant:

void mapDraw(const std::vector<Obstacle>& obstalces, const Obstacle& obst, cv::Mat& src) {
    for (size_t i = 0; i <  obstalces.size(); i++) {
        cv::drawContours(src, obstalces, i, cv::Scalar(80, 80, 80), -1);
        cv::drawContours(src, obstalces, i, cv::Scalar(255, 0, 0), 3);
        for (const cv::Point& pt: obstalces[i]) {
            cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
        }
    }
    for (size_t i = 1; i < obst.size(); i++) {
        cv::line(src, obst[i - 1], obst[i], cv::Scalar(0, 255, 0), 3);
    }
    for (const cv::Point& pt: obst) {
        cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
    }
}